

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder_suite.cpp
# Opt level: O3

void literal_suite::test_string(void)

{
  long *plVar1;
  encoder_type encoder;
  ostringstream result;
  undefined4 local_1cc;
  long *local_1c8 [2];
  long local_1b8 [2];
  undefined **local_1a8;
  ostringstream *local_1a0;
  long local_180 [4];
  int aiStack_160 [20];
  ios_base local_110 [264];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_180);
  local_1a8 = &PTR__base_00118c10;
  local_1a0 = (ostringstream *)local_180;
  if (*(int *)((long)aiStack_160 + *(long *)(local_180[0] + -0x18)) == 0) {
    plVar1 = (long *)0x5;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_180,"alpha",5);
  }
  else {
    plVar1 = (long *)0x0;
  }
  local_1cc = 5;
  local_1c8[0] = plVar1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("encoder.literal(\"alpha\")","5",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/encoder_suite.cpp"
             ,0x3e5,"void literal_suite::test_string()",local_1c8,&local_1cc);
  std::__cxx11::stringbuf::str();
  boost::detail::test_with_impl<boost::detail::lw_test_eq,std::__cxx11::string,char[6]>
            ("result.str()","\"alpha\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/encoder_suite.cpp"
             ,0x3e6,"void literal_suite::test_string()",local_1c8,"alpha");
  if (local_1c8[0] != local_1b8) {
    operator_delete(local_1c8[0],local_1b8[0] + 1);
  }
  (*(code *)*local_1a8)();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_180);
  std::ios_base::~ios_base(local_110);
  return;
}

Assistant:

void test_string()
{
    std::ostringstream result;
    encoder_type encoder(result);
    TRIAL_PROTOCOL_TEST_EQUAL(encoder.literal("alpha"), 5);
    TRIAL_PROTOCOL_TEST_EQUAL(result.str(), "alpha");
}